

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snestistics.cpp
# Opt level: O3

void data_report(ReportWriter *writer,Trace *trace,AnnotationResolver *annotations,
                bool include_hwregs,bool include_7e7f)

{
  uint resolve_adress;
  uint uVar1;
  _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  *p_Var2;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  size_t sVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  size_t sVar14;
  size_t sVar15;
  pointer pMVar16;
  uint uVar17;
  _Base_ptr p_Var18;
  _Base_ptr p_Var19;
  pointer pMVar20;
  _Base_ptr p_Var21;
  uint uVar22;
  _Base_ptr p_Var23;
  _Rb_tree_header *p_Var24;
  _Rb_tree_color _Var25;
  ulong uVar26;
  _Rb_tree_header *p_Var27;
  undefined7 in_register_00000081;
  _Rb_tree_header *p_Var28;
  _Base_ptr p_Var29;
  _Base_ptr p_Var30;
  Annotation *pAVar31;
  uint32_t j;
  ulong uVar32;
  bool bVar33;
  Annotation *accessed_function;
  AccessIterator readers;
  Annotation *data;
  AccessIterator writers;
  Profile profile;
  StringBuilder sb;
  uint local_1238;
  uint local_1224;
  _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  local_1220;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_11f0;
  _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  local_11c0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_1190;
  _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  local_1160;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_1130;
  _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  local_1100;
  _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  local_10d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_10a0;
  uint local_1090;
  Annotation *local_1088;
  uint local_1080;
  undefined4 local_107c;
  undefined8 local_1078;
  _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  *local_1070;
  uint local_1068;
  AnnotationResolver *local_1060;
  ReportWriter *local_1058;
  Profile local_1050;
  StringBuilder local_1034;
  
  local_107c = (undefined4)CONCAT71(in_register_00000081,include_7e7f);
  local_1060 = annotations;
  memset(&local_1034,0,0x1004);
  local_1050._msg = "Data report";
  local_1050._start = clock();
  local_1050._hide_if_fast = true;
  ReportWriter::writeSeperator(writer,"Data analysis");
  local_1034._length = 0;
  local_1034._backing[0] = '\0';
  snestistics::StringBuilder::format(&local_1034,"DATA RANGE");
  snestistics::StringBuilder::column(&local_1034,0x14,4);
  snestistics::StringBuilder::format(&local_1034,"READERS");
  snestistics::StringBuilder::column(&local_1034,0x3c,4);
  snestistics::StringBuilder::format(&local_1034,"WRITERS");
  snestistics::StringBuilder::column(&local_1034,0x5a,4);
  snestistics::StringBuilder::format(&local_1034,"ANNOTATIONS");
  ReportWriter::writeSeperator(writer,local_1034._backing);
  local_1100._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1100._M_impl.super__Rb_tree_header._M_header;
  local_1100._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1100._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1100._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1130._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1130._M_impl.super__Rb_tree_header._M_header;
  local_1130._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1130._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1160._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1160._M_impl.super__Rb_tree_header._M_header;
  local_1160._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1160._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1160._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_10d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_10d0._M_impl.super__Rb_tree_header._M_header;
  local_10d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_10d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_10d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar16 = (trace->memory_accesses).
            super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pMVar20 = (trace->memory_accesses).
            super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_1160._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1160._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1130._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1130._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1100._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1100._M_impl.super__Rb_tree_header._M_header._M_left;
  local_10d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_10d0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1058 = writer;
  if (pMVar20 != pMVar16) {
    local_1238 = 0xffffffff;
    local_1224 = 0xffffffff;
    pAVar31 = (Annotation *)0x0;
    uVar32 = 0;
    do {
      resolve_adress = pMVar16[uVar32].adress;
      if ((resolve_adress & 0xfe0000) == 0x7e0000) {
        if ((char)local_107c == '\0') goto LAB_0012ed26;
LAB_0012ed4b:
        local_1088 = (Annotation *)0x0;
        local_1220._M_impl._0_8_ = 0;
        snestistics::AnnotationResolver::resolve_annotation
                  (local_1060,resolve_adress,(Annotation **)&local_1220,&local_1088);
        if (local_1220._M_impl._0_8_ == 0) {
          uVar22 = 0;
          local_1220._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_1220._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_1220._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_1220._M_impl.super__Rb_tree_header._M_header;
          local_1220._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_1190._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_1190._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_1190._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_1190._M_impl.super__Rb_tree_header._M_header;
          local_1190._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_11c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_11c0._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_11c0._M_impl.super__Rb_tree_header._M_header;
          local_11c0._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_11f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_11f0._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_11f0._M_impl.super__Rb_tree_header._M_header;
          local_11f0._M_impl.super__Rb_tree_header._M_node_count = 0;
          pMVar16 = (trace->memory_accesses).
                    super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_1220._M_impl.super__Rb_tree_header._M_header._M_right =
               local_1220._M_impl.super__Rb_tree_header._M_header._M_left;
          local_11f0._M_impl.super__Rb_tree_header._M_header._M_right =
               local_11f0._M_impl.super__Rb_tree_header._M_header._M_left;
          local_11c0._M_impl.super__Rb_tree_header._M_header._M_right =
               local_11c0._M_impl.super__Rb_tree_header._M_header._M_left;
          local_1190._M_impl.super__Rb_tree_header._M_header._M_right =
               local_1190._M_impl.super__Rb_tree_header._M_header._M_left;
          if (uVar32 < (ulong)((long)(trace->memory_accesses).
                                     super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar16 >> 3
                              )) {
            uVar22 = 0;
            do {
              if (resolve_adress != pMVar16[uVar32].adress) break;
              uVar1 = pMVar16[uVar32].pc;
              local_1078 = (_Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
                            *)(CONCAT44(local_1078._4_4_,uVar1) & 0xffffffff7fffffff);
              local_10a0._M_allocated_capacity = 0;
              snestistics::AnnotationResolver::resolve_annotation
                        (local_1060,uVar1 & 0x7fffffff,
                         (Annotation **)&local_10a0._M_allocated_capacity,(Annotation **)0x0);
              if (local_10a0._M_allocated_capacity == 0) {
                if ((int)uVar1 < 0) {
                  std::
                  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  ::_M_insert_unique<unsigned_int_const&>
                            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                              *)&local_11f0,(uint *)&local_1078);
                  if (uVar22 == 0) {
                    p_Var30 = &local_11f0._M_impl.super__Rb_tree_header._M_header;
                    p_Var29 = p_Var30;
                    if (local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent !=
                        (_Base_ptr)0x0) {
                      p_Var29 = local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent;
                      do {
                        p_Var21 = p_Var29;
                        p_Var19 = p_Var30;
                        _Var25 = p_Var21[1]._M_color;
                        p_Var23 = p_Var21;
                        if (_Var25 < (_Rb_tree_color)local_1078) {
                          p_Var23 = p_Var19;
                        }
                        p_Var30 = p_Var23;
                        p_Var29 = (&p_Var21->_M_left)[_Var25 < (_Rb_tree_color)local_1078];
                      } while ((&p_Var21->_M_left)[_Var25 < (_Rb_tree_color)local_1078] !=
                               (_Base_ptr)0x0);
                      p_Var3 = &local_11f0;
                      goto LAB_0012f0ae;
                    }
                    goto LAB_0012f0c6;
                  }
                }
                else {
                  std::
                  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                  ::_M_insert_unique<unsigned_int_const&>
                            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                              *)&local_1190,(uint *)&local_1078);
                  if (uVar22 == 0) {
                    p_Var30 = &local_1130._M_impl.super__Rb_tree_header._M_header;
                    p_Var29 = p_Var30;
                    if (local_1130._M_impl.super__Rb_tree_header._M_header._M_parent !=
                        (_Base_ptr)0x0) {
                      p_Var29 = local_1130._M_impl.super__Rb_tree_header._M_header._M_parent;
                      do {
                        p_Var21 = p_Var29;
                        p_Var19 = p_Var30;
                        _Var25 = p_Var21[1]._M_color;
                        p_Var23 = p_Var21;
                        if (_Var25 < (_Rb_tree_color)local_1078) {
                          p_Var23 = p_Var19;
                        }
                        p_Var30 = p_Var23;
                        p_Var29 = (&p_Var21->_M_left)[_Var25 < (_Rb_tree_color)local_1078];
                      } while ((&p_Var21->_M_left)[_Var25 < (_Rb_tree_color)local_1078] !=
                               (_Base_ptr)0x0);
                      p_Var3 = &local_1130;
LAB_0012f0ae:
                      p_Var30 = &(p_Var3->_M_impl).super__Rb_tree_header._M_header;
                      p_Var29 = p_Var30;
                      if (p_Var23 != p_Var30) {
                        if (_Var25 < (_Rb_tree_color)local_1078) {
                          p_Var21 = p_Var19;
                        }
                        bVar33 = (_Rb_tree_color)local_1078 < p_Var21[1]._M_color;
                        goto LAB_0012f0bf;
                      }
                    }
                    goto LAB_0012f0c6;
                  }
                }
              }
              else if ((int)uVar1 < 0) {
                std::
                _Rb_tree<snestistics::Annotation_const*,snestistics::Annotation_const*,std::_Identity<snestistics::Annotation_const*>,std::less<snestistics::Annotation_const*>,std::allocator<snestistics::Annotation_const*>>
                ::_M_insert_unique<snestistics::Annotation_const*const&>
                          ((_Rb_tree<snestistics::Annotation_const*,snestistics::Annotation_const*,std::_Identity<snestistics::Annotation_const*>,std::less<snestistics::Annotation_const*>,std::allocator<snestistics::Annotation_const*>>
                            *)&local_11c0,(Annotation **)&local_10a0._M_allocated_capacity);
                if (uVar22 == 0) {
                  p_Var30 = &local_1160._M_impl.super__Rb_tree_header._M_header;
                  p_Var21 = local_1160._M_impl.super__Rb_tree_header._M_header._M_parent;
                  p_Var29 = p_Var30;
                  if (local_1160._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0
                     ) {
                    do {
                      p_Var19 = p_Var21;
                      p_Var18 = p_Var30;
                      uVar26 = *(ulong *)(p_Var19 + 1);
                      p_Var23 = p_Var19;
                      if (uVar26 < local_10a0._M_allocated_capacity) {
                        p_Var23 = p_Var18;
                      }
                      p_Var30 = p_Var23;
                      p_Var21 = (&p_Var19->_M_left)[uVar26 < local_10a0._M_allocated_capacity];
                    } while ((&p_Var19->_M_left)[uVar26 < local_10a0._M_allocated_capacity] !=
                             (_Base_ptr)0x0);
                    p_Var2 = &local_1160;
                    goto LAB_0012f038;
                  }
                  goto LAB_0012f0c6;
                }
              }
              else {
                std::
                _Rb_tree<snestistics::Annotation_const*,snestistics::Annotation_const*,std::_Identity<snestistics::Annotation_const*>,std::less<snestistics::Annotation_const*>,std::allocator<snestistics::Annotation_const*>>
                ::_M_insert_unique<snestistics::Annotation_const*const&>
                          ((_Rb_tree<snestistics::Annotation_const*,snestistics::Annotation_const*,std::_Identity<snestistics::Annotation_const*>,std::less<snestistics::Annotation_const*>,std::allocator<snestistics::Annotation_const*>>
                            *)&local_1220,(Annotation **)&local_10a0._M_allocated_capacity);
                if (uVar22 == 0) {
                  p_Var30 = &local_1100._M_impl.super__Rb_tree_header._M_header;
                  p_Var21 = local_1100._M_impl.super__Rb_tree_header._M_header._M_parent;
                  p_Var29 = p_Var30;
                  if (local_1100._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0
                     ) {
                    do {
                      p_Var19 = p_Var21;
                      p_Var18 = p_Var30;
                      uVar26 = *(ulong *)(p_Var19 + 1);
                      p_Var23 = p_Var19;
                      if (uVar26 < local_10a0._M_allocated_capacity) {
                        p_Var23 = p_Var18;
                      }
                      p_Var30 = p_Var23;
                      p_Var21 = (&p_Var19->_M_left)[uVar26 < local_10a0._M_allocated_capacity];
                    } while ((&p_Var19->_M_left)[uVar26 < local_10a0._M_allocated_capacity] !=
                             (_Base_ptr)0x0);
                    p_Var2 = &local_1100;
LAB_0012f038:
                    p_Var30 = &(p_Var2->_M_impl).super__Rb_tree_header._M_header;
                    p_Var29 = p_Var30;
                    if (p_Var23 != p_Var30) {
                      if (uVar26 < local_10a0._M_allocated_capacity) {
                        p_Var19 = p_Var18;
                      }
                      bVar33 = local_10a0._M_allocated_capacity < *(ulong *)(p_Var19 + 1);
LAB_0012f0bf:
                      p_Var29 = p_Var23;
                      if (bVar33) {
                        p_Var29 = p_Var30;
                      }
                    }
                  }
LAB_0012f0c6:
                  if (p_Var29 == p_Var30) {
                    uVar22 = 1;
                  }
                }
              }
              uVar32 = (ulong)((int)uVar32 + 1);
              pMVar16 = (trace->memory_accesses).
                        super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar32 < (ulong)((long)(trace->memory_accesses).
                                            super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pMVar16 >> 3));
          }
          if (local_1088 != pAVar31) {
            uVar22 = 1;
          }
          if (local_1238 != 0xffffffff) {
            if ((local_1220._M_impl.super__Rb_tree_header._M_node_count !=
                 local_1100._M_impl.super__Rb_tree_header._M_node_count) ||
               (local_1130._M_impl.super__Rb_tree_header._M_node_count !=
                local_1190._M_impl.super__Rb_tree_header._M_node_count)) {
              uVar22 = 1;
            }
            if ((local_11c0._M_impl.super__Rb_tree_header._M_node_count !=
                 local_1160._M_impl.super__Rb_tree_header._M_node_count) ||
               (local_10d0._M_impl.super__Rb_tree_header._M_node_count !=
                local_11f0._M_impl.super__Rb_tree_header._M_node_count)) {
              uVar22 = 1;
            }
          }
          local_10a0._M_allocated_capacity = (size_type)&local_1100;
          local_10a0._8_8_ = &local_1130;
          local_1078 = &local_1160;
          local_1070 = &local_10d0;
          local_1068 = 0;
          if (uVar22 != 0) {
            bVar33 = true;
            local_1080 = uVar22;
            do {
              uVar1 = local_1068;
              if ((uint)((int)local_1130._M_impl.super__Rb_tree_header._M_node_count +
                        (int)local_1100._M_impl.super__Rb_tree_header._M_node_count) <= local_1068)
              {
                uVar17 = resolve_adress;
                uVar22 = local_1080;
                if ((uint)((int)local_10d0._M_impl.super__Rb_tree_header._M_node_count +
                          (int)local_1160._M_impl.super__Rb_tree_header._M_node_count) <= local_1068
                   ) goto LAB_0012f346;
              }
              local_1034._length = 0;
              local_1034._backing[0] = '\0';
              local_1090 = local_1068;
              if (bVar33) {
                if (local_1238 == local_1224) {
                  snestistics::StringBuilder::format(&local_1034,"%06X");
                }
                else {
                  snestistics::StringBuilder::format(&local_1034,"%06X-%06X");
                }
              }
              if (uVar1 < (uint)((int)local_1130._M_impl.super__Rb_tree_header._M_node_count +
                                (int)local_1100._M_impl.super__Rb_tree_header._M_node_count)) {
                snestistics::StringBuilder::column(&local_1034,0x14,4);
                data_report(ReportWriter&,snestistics::Trace_const&,snestistics::
                AnnotationResolver_const&,bool,bool)::AccessIterator::emit(snestistics::
                StringBuilder__(&local_10a0,&local_1034);
              }
              if (uVar1 < (uint)((int)local_10d0._M_impl.super__Rb_tree_header._M_node_count +
                                (int)local_1160._M_impl.super__Rb_tree_header._M_node_count)) {
                snestistics::StringBuilder::column(&local_1034,0x3c,4);
                data_report(ReportWriter&,snestistics::Trace_const&,snestistics::
                AnnotationResolver_const&,bool,bool)::AccessIterator::emit(snestistics::
                StringBuilder__(&local_1078,&local_1034);
              }
              if ((bool)(bVar33 & pAVar31 != (Annotation *)0x0)) {
                snestistics::StringBuilder::column(&local_1034,0x5a,4);
                snestistics::StringBuilder::format
                          (&local_1034,"%s [%06X-%06X]",(pAVar31->name)._M_dataplus._M_p,
                           (ulong)pAVar31->startOfRange,(ulong)pAVar31->endOfRange);
              }
              ReportWriter::writeComment(local_1058,&local_1034);
              local_1068 = uVar1 + 1;
              bVar33 = false;
            } while( true );
          }
          uVar17 = local_1238;
          if (local_1238 == 0xffffffff) {
            uVar17 = resolve_adress;
          }
LAB_0012f346:
          sVar14 = local_1100._M_impl.super__Rb_tree_header._M_node_count;
          p_Var13 = local_1100._M_impl.super__Rb_tree_header._M_header._M_right;
          p_Var12 = local_1100._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var11 = local_1100._M_impl.super__Rb_tree_header._M_header._M_parent;
          sVar10 = local_1130._M_impl.super__Rb_tree_header._M_node_count;
          p_Var9 = local_1130._M_impl.super__Rb_tree_header._M_header._M_right;
          p_Var8 = local_1130._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var7 = local_1130._M_impl.super__Rb_tree_header._M_header._M_parent;
          sVar15 = local_1160._M_impl.super__Rb_tree_header._M_node_count;
          p_Var6 = local_1160._M_impl.super__Rb_tree_header._M_header._M_right;
          p_Var5 = local_1160._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var4 = local_1160._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var18 = local_1190._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var19 = local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var23 = local_11f0._M_impl.super__Rb_tree_header._M_header._M_right;
          p_Var21 = local_11f0._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var29 = local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var30 = local_1220._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (local_1238 == 0xffffffff || (uVar22 & 1) != 0) {
            if (local_1100._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
              if (local_1220._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_1100._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_1220._M_impl.super__Rb_tree_header._M_header._M_color;
                local_1100._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_1220._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_1100._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_1220._M_impl.super__Rb_tree_header._M_header._M_left;
                local_1100._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_1220._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_1220._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &local_1100._M_impl.super__Rb_tree_header._M_header;
                local_1100._M_impl.super__Rb_tree_header._M_node_count =
                     local_1220._M_impl.super__Rb_tree_header._M_node_count;
                local_1220._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_1220._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_1220._M_impl.super__Rb_tree_header._M_header;
                local_1220._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_1220._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_1220._M_impl.super__Rb_tree_header._M_header._M_left;
              }
            }
            else {
              p_Var24 = &local_1100._M_impl.super__Rb_tree_header;
              if (local_1220._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
                local_1220._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_1100._M_impl.super__Rb_tree_header._M_header._M_color;
                local_1220._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_1100._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_1220._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_1100._M_impl.super__Rb_tree_header._M_header._M_left;
                local_1220._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_1100._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_1100._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &local_1220._M_impl.super__Rb_tree_header._M_header;
                local_1220._M_impl.super__Rb_tree_header._M_node_count =
                     local_1100._M_impl.super__Rb_tree_header._M_node_count;
                local_1100._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_1100._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_1100._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var24->_M_header;
                local_1100._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var24->_M_header;
              }
              else {
                local_1100._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_1220._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_1220._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var11;
                local_1100._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_1220._M_impl.super__Rb_tree_header._M_header._M_left;
                local_1100._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_1220._M_impl.super__Rb_tree_header._M_header._M_right;
                local_1220._M_impl.super__Rb_tree_header._M_header._M_left = p_Var12;
                local_1220._M_impl.super__Rb_tree_header._M_header._M_right = p_Var13;
                p_Var30->_M_parent = &p_Var24->_M_header;
                p_Var11->_M_parent = &local_1220._M_impl.super__Rb_tree_header._M_header;
                local_1100._M_impl.super__Rb_tree_header._M_node_count =
                     local_1220._M_impl.super__Rb_tree_header._M_node_count;
                local_1220._M_impl.super__Rb_tree_header._M_node_count = sVar14;
              }
            }
            p_Var28 = &local_11f0._M_impl.super__Rb_tree_header;
            p_Var27 = &local_1160._M_impl.super__Rb_tree_header;
            p_Var24 = &local_1130._M_impl.super__Rb_tree_header;
            if (local_1160._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
              if (local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_1160._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_11c0._M_impl.super__Rb_tree_header._M_header._M_color;
                local_1160._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_1160._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_11c0._M_impl.super__Rb_tree_header._M_header._M_left;
                local_1160._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_11c0._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &p_Var27->_M_header;
                local_1160._M_impl.super__Rb_tree_header._M_node_count =
                     local_11c0._M_impl.super__Rb_tree_header._M_node_count;
                local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_11c0._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_11c0._M_impl.super__Rb_tree_header._M_header;
                local_11c0._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_11c0._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_11c0._M_impl.super__Rb_tree_header._M_header._M_left;
              }
            }
            else if (local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
            {
              local_11c0._M_impl.super__Rb_tree_header._M_header._M_color =
                   local_1160._M_impl.super__Rb_tree_header._M_header._M_color;
              local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent =
                   local_1160._M_impl.super__Rb_tree_header._M_header._M_parent;
              local_11c0._M_impl.super__Rb_tree_header._M_header._M_left =
                   local_1160._M_impl.super__Rb_tree_header._M_header._M_left;
              local_11c0._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_1160._M_impl.super__Rb_tree_header._M_header._M_right;
              (local_1160._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                   &local_11c0._M_impl.super__Rb_tree_header._M_header;
              local_11c0._M_impl.super__Rb_tree_header._M_node_count =
                   local_1160._M_impl.super__Rb_tree_header._M_node_count;
              local_1160._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_1160._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_1160._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var27->_M_header;
              local_1160._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var27->_M_header;
            }
            else {
              local_1160._M_impl.super__Rb_tree_header._M_header._M_parent =
                   local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent;
              local_11c0._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var4;
              local_1160._M_impl.super__Rb_tree_header._M_header._M_left =
                   local_11c0._M_impl.super__Rb_tree_header._M_header._M_left;
              local_1160._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_11c0._M_impl.super__Rb_tree_header._M_header._M_right;
              local_11c0._M_impl.super__Rb_tree_header._M_header._M_left = p_Var5;
              local_11c0._M_impl.super__Rb_tree_header._M_header._M_right = p_Var6;
              p_Var19->_M_parent = &p_Var27->_M_header;
              p_Var4->_M_parent = &local_11c0._M_impl.super__Rb_tree_header._M_header;
              local_1160._M_impl.super__Rb_tree_header._M_node_count =
                   local_11c0._M_impl.super__Rb_tree_header._M_node_count;
              local_11c0._M_impl.super__Rb_tree_header._M_node_count = sVar15;
            }
            if (local_1130._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
              if (local_1190._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_1130._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_1190._M_impl.super__Rb_tree_header._M_header._M_color;
                local_1130._M_impl.super__Rb_tree_header._M_header._M_parent =
                     local_1190._M_impl.super__Rb_tree_header._M_header._M_parent;
                local_1130._M_impl.super__Rb_tree_header._M_header._M_left =
                     local_1190._M_impl.super__Rb_tree_header._M_header._M_left;
                local_1130._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_1190._M_impl.super__Rb_tree_header._M_header._M_right;
                (local_1190._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &p_Var24->_M_header;
                local_1130._M_impl.super__Rb_tree_header._M_node_count =
                     local_1190._M_impl.super__Rb_tree_header._M_node_count;
                local_1190._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_1190._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_1190._M_impl.super__Rb_tree_header._M_header;
                local_1190._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_1190._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_1190._M_impl.super__Rb_tree_header._M_header._M_left;
              }
            }
            else if (local_1190._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
            {
              local_1190._M_impl.super__Rb_tree_header._M_header._M_color =
                   local_1130._M_impl.super__Rb_tree_header._M_header._M_color;
              local_1190._M_impl.super__Rb_tree_header._M_header._M_parent =
                   local_1130._M_impl.super__Rb_tree_header._M_header._M_parent;
              local_1190._M_impl.super__Rb_tree_header._M_header._M_left =
                   local_1130._M_impl.super__Rb_tree_header._M_header._M_left;
              local_1190._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_1130._M_impl.super__Rb_tree_header._M_header._M_right;
              (local_1130._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                   &local_1190._M_impl.super__Rb_tree_header._M_header;
              local_1190._M_impl.super__Rb_tree_header._M_node_count =
                   local_1130._M_impl.super__Rb_tree_header._M_node_count;
              local_1130._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_1130._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_1130._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var24->_M_header;
              local_1130._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var24->_M_header;
            }
            else {
              local_1130._M_impl.super__Rb_tree_header._M_header._M_parent =
                   local_1190._M_impl.super__Rb_tree_header._M_header._M_parent;
              local_1190._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var7;
              local_1130._M_impl.super__Rb_tree_header._M_header._M_left =
                   local_1190._M_impl.super__Rb_tree_header._M_header._M_left;
              local_1130._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_1190._M_impl.super__Rb_tree_header._M_header._M_right;
              local_1190._M_impl.super__Rb_tree_header._M_header._M_left = p_Var8;
              local_1190._M_impl.super__Rb_tree_header._M_header._M_right = p_Var9;
              p_Var18->_M_parent = &p_Var24->_M_header;
              p_Var7->_M_parent = &local_1190._M_impl.super__Rb_tree_header._M_header;
              local_1130._M_impl.super__Rb_tree_header._M_node_count =
                   local_1190._M_impl.super__Rb_tree_header._M_node_count;
              local_1190._M_impl.super__Rb_tree_header._M_node_count = sVar10;
            }
            pAVar31 = local_1088;
            if (local_10d0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
              if (local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
                local_10d0._M_impl.super__Rb_tree_header._M_header._M_color =
                     local_11f0._M_impl.super__Rb_tree_header._M_header._M_color;
                (local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                     &local_10d0._M_impl.super__Rb_tree_header._M_header;
                sVar15 = 0;
                local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_11f0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var28->_M_header;
                local_11f0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var28->_M_header;
                goto LAB_0012f833;
              }
            }
            else if (local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
            {
              local_11f0._M_impl.super__Rb_tree_header._M_header._M_color =
                   local_10d0._M_impl.super__Rb_tree_header._M_header._M_color;
              local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent =
                   local_10d0._M_impl.super__Rb_tree_header._M_header._M_parent;
              local_11f0._M_impl.super__Rb_tree_header._M_header._M_left =
                   local_10d0._M_impl.super__Rb_tree_header._M_header._M_left;
              local_11f0._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_10d0._M_impl.super__Rb_tree_header._M_header._M_right;
              (local_10d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                   &p_Var28->_M_header;
              local_11f0._M_impl.super__Rb_tree_header._M_node_count =
                   local_10d0._M_impl.super__Rb_tree_header._M_node_count;
              local_10d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_10d0._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_10d0._M_impl.super__Rb_tree_header._M_header;
              local_10d0._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_10d0._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_10d0._M_impl.super__Rb_tree_header._M_header._M_left;
            }
            else {
              local_11f0._M_impl.super__Rb_tree_header._M_header._M_parent =
                   local_10d0._M_impl.super__Rb_tree_header._M_header._M_parent;
              local_11f0._M_impl.super__Rb_tree_header._M_header._M_left =
                   local_10d0._M_impl.super__Rb_tree_header._M_header._M_left;
              local_11f0._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_10d0._M_impl.super__Rb_tree_header._M_header._M_right;
              p_Var29->_M_parent = &local_10d0._M_impl.super__Rb_tree_header._M_header;
              (local_10d0._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
                   &p_Var28->_M_header;
              sVar15 = local_10d0._M_impl.super__Rb_tree_header._M_node_count;
LAB_0012f833:
              local_10d0._M_impl.super__Rb_tree_header._M_node_count =
                   local_11f0._M_impl.super__Rb_tree_header._M_node_count;
              local_10d0._M_impl.super__Rb_tree_header._M_header._M_right = p_Var23;
              local_10d0._M_impl.super__Rb_tree_header._M_header._M_left = p_Var21;
              local_10d0._M_impl.super__Rb_tree_header._M_header._M_parent = p_Var29;
              local_11f0._M_impl.super__Rb_tree_header._M_node_count = sVar15;
            }
          }
          local_1090 = local_1068;
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&local_11f0);
          std::
          _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
          ::~_Rb_tree(&local_11c0);
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree(&local_1190);
          std::
          _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
          ::~_Rb_tree(&local_1220);
          pMVar16 = (trace->memory_accesses).
                    super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pMVar20 = (trace->memory_accesses).
                    super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          local_1238 = uVar17;
          local_1224 = resolve_adress;
        }
        else {
          pMVar16 = (trace->memory_accesses).
                    super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pMVar20 = (trace->memory_accesses).
                    super__Vector_base<snestistics::Trace::MemoryAccess,_std::allocator<snestistics::Trace::MemoryAccess>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (; (uVar32 < (ulong)((long)pMVar20 - (long)pMVar16 >> 3) &&
                 (resolve_adress == pMVar16[uVar32].adress)); uVar32 = (ulong)((int)uVar32 + 1)) {
          }
        }
      }
      else {
        if ((resolve_adress & 0xfc00) - 0x4400 < 0xffffdc00 || include_hwregs) goto LAB_0012ed4b;
LAB_0012ed26:
        uVar32 = (ulong)((int)uVar32 + 1);
      }
    } while (uVar32 < (ulong)((long)pMVar20 - (long)pMVar16 >> 3));
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&local_10d0);
  std::
  _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  ::~_Rb_tree(&local_1160);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_1130);
  std::
  _Rb_tree<const_snestistics::Annotation_*,_const_snestistics::Annotation_*,_std::_Identity<const_snestistics::Annotation_*>,_std::less<const_snestistics::Annotation_*>,_std::allocator<const_snestistics::Annotation_*>_>
  ::~_Rb_tree(&local_1100);
  snestistics::Profile::~Profile(&local_1050);
  return;
}

Assistant:

void data_report(ReportWriter &writer, const Trace &trace, const AnnotationResolver &annotations, const bool include_hwregs = true, const bool include_7e7f = true) {
	StringBuilder sb;

	Profile profile("Data report", true);
	writer.writeSeperator("Data analysis");

	sb.clear();
	sb.format("DATA RANGE");
	sb.column(20);
	sb.format("READERS");
	sb.column(60);
	sb.format("WRITERS");
	sb.column(90);
	sb.format("ANNOTATIONS");
	writer.writeSeperator(sb.c_str());

	Pointer first_global = INVALID_POINTER, last_global = INVALID_POINTER;

	std::set<const Annotation*> global_readers;
	std::set<uint32_t> global_unknown_readers;
	std::set<const Annotation*> global_writers;
	std::set<uint32_t> global_unknown_writers;
	const Annotation *global_data = nullptr;

	for (uint32_t p = 0; p < trace.memory_accesses.size(); ) {
		const Trace::MemoryAccess ra = trace.memory_accesses[p];
		Pointer adress = ra.adress;

		// This code ignores data reads from WRAM and/or hardware registers (if requested)
		{
			const uint8_t bank = adress>>16;
			const uint32_t bank_less_adress = adress&0xFFFF;
			if (bank == 0x7E || bank == 0x7F) {
				if (!include_7e7f) {
					p++;
					continue;
				}
			} else if (!include_hwregs && bank_less_adress >= 0x2000 && bank_less_adress <= 0x43FF) {
				p++;
				continue;
			}
		}

		const Annotation *data = nullptr;

		// Don't care about accesses to code
		// TODO: Check so we don't write code?
		{
			const Annotation *accessed_function = nullptr;
			annotations.resolve_annotation(adress, &accessed_function, &data);
			if (accessed_function != nullptr) {
				for (uint32_t j=p; j<trace.memory_accesses.size(); j++, p++) {
					const Trace::MemoryAccess rb = trace.memory_accesses[j];
					if (adress != rb.adress) break;
				}
				continue;
			}
		}

		bool need_flush = false;
		std::set<const Annotation*> new_readers;
		std::set<uint32_t> new_unknown_readers;
		std::set<const Annotation*> new_writers;
		std::set<uint32_t> new_unknown_writers;

		for (uint32_t j=p; j<trace.memory_accesses.size(); j++, p++) {
			const Trace::MemoryAccess rb = trace.memory_accesses[j];
			if (adress != rb.adress) break;

			const bool is_write = (rb.pc & 0x80000000)!=0;
			const Pointer pc = is_write ? rb.pc & ~0x80000000 : rb.pc;

			const Annotation *our_function = nullptr;
			annotations.resolve_annotation(pc, &our_function);

			if (our_function) {
				if (is_write) {
					new_writers.insert(our_function);
					if (!need_flush && global_writers.find(our_function) == global_writers.end()) need_flush = true;
				} else {
					new_readers.insert(our_function);
					if (!need_flush && global_readers.find(our_function) == global_readers.end()) need_flush = true;
				}
			} else {
				if (is_write) {
					new_unknown_writers.insert(pc);
					if (!need_flush && new_unknown_writers.find(pc) == new_unknown_writers.end()) need_flush = true;
				} else {
					new_unknown_readers.insert(pc);
					if (!need_flush && global_unknown_readers.find(pc) == global_unknown_readers.end()) need_flush = true;
				}
			}
		}

		if (data != global_data)
			need_flush = true;

		// We know that we aren't adding any new readers/writers, but did we produce the same full list?
		if (first_global != INVALID_POINTER) {
			if ((new_readers.size() != global_readers.size()) || (global_unknown_readers.size() != new_unknown_readers.size())) {
				need_flush = true;
			}
			if ((new_writers.size() != global_writers.size()) || (global_unknown_writers.size() != new_unknown_writers.size())) {
				need_flush = true;
			}
		}

		bool update_globals = false;
		if (need_flush || first_global == INVALID_POINTER) {
			update_globals = true;
		}

		struct AccessIterator {
			AccessIterator(const std::set<const Annotation*> &known, const std::set<uint32_t> &unknown) : _known(known), _unknown(unknown) {}
			const std::set<const Annotation*> &_known;
			const std::set<uint32_t> &_unknown;

			uint32_t _current = 0;
			bool has() {
				const uint32_t total = (uint32_t)_known.size() + (uint32_t)_unknown.size();
				return _current < total;
			}
			void advance() {
				_current++;
			}
			void emit(StringBuilder &sb) {
				if (_current < _known.size()) {
					auto it = _known.begin();
					for (uint32_t i=0; i<_current; i++, it++);
					const Annotation *a = *it;
					sb.format("%s", a->name.c_str());
				} else {
					uint32_t lc = _current - (uint32_t)_known.size();
					auto it = _unknown.begin();
					for (uint32_t i=0; i<lc; i++, it++);
					const uint32_t pc = *it;
					sb.format("%06X", pc);
				}
			}
		};

		AccessIterator readers(global_readers, global_unknown_readers);
		AccessIterator writers(global_writers, global_unknown_writers);

		// If last range was finished, print it
		if (need_flush) {
			bool first_line = true;
			while (readers.has() || writers.has()) {
				sb.clear();
				if (first_line) {
					if (first_global != last_global)
						sb.format("%06X-%06X", first_global, last_global);
					else
						sb.format("%06X", first_global);
				}
				if (readers.has()) {
					sb.column(20);
					readers.emit(sb);
				}
				if (writers.has()) {
					sb.column(60);
					writers.emit(sb);
				}
				if (first_line) {
					if (global_data) {
						sb.column(90);
						sb.format("%s [%06X-%06X]", global_data->name.c_str(), global_data->startOfRange, global_data->endOfRange);
					}
				}
				writer.writeComment(sb);
				first_line = false;
				readers.advance();
				writers.advance();
			}
			first_global = last_global = adress;
		} else {
			if (first_global == INVALID_POINTER) first_global = adress;
			last_global = adress;
		}
		
		if (update_globals) {
			std::swap(global_readers, new_readers);
			std::swap(global_writers, new_writers);
			std::swap(global_unknown_readers, new_unknown_readers);
			std::swap(global_unknown_writers, new_unknown_writers);
			global_data = data;
		}
	}

	// TODO: Print last range
}